

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainstate.h
# Opt level: O3

bool CreateAndActivateUTXOSnapshot<__25_const>(long fixture)

{
  _Variadic_union<CBlockIndex_*> _Var1;
  _Base_ptr *pp_Var2;
  _Type auVar3;
  long lVar4;
  pointer ppCVar5;
  vector<std::byte,_std::allocator<std::byte>_> data_xor;
  vector<std::byte,_std::allocator<std::byte>_> data_xor_00;
  Chainstate *pCVar6;
  FILE *pFVar7;
  CBlockIndex *block;
  long in_FS_OFFSET;
  initializer_list<unsigned_short> __l;
  string_view source_file;
  string_view logging_function;
  undefined8 in_stack_fffffffffffffda8;
  void *pvVar8;
  undefined8 in_stack_fffffffffffffdb0;
  pointer in_stack_fffffffffffffdb8;
  long lVar9;
  int height;
  allocator_type local_212;
  less<unsigned_short> local_211;
  AutoFile auto_infile;
  Result<CBlockIndex_*> res;
  SnapshotMetadata metadata;
  UniValue result;
  AutoFile auto_outfile;
  path local_b0;
  path snapshot_path;
  path root;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  std::filesystem::__cxx11::path::path(&root.super_path,(path *)(fixture + 0x198));
  metadata.m_supported_versions._M_t._M_impl._0_8_ = &cs_main;
  metadata.m_supported_versions._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red
  ;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&metadata);
  pCVar6 = ChainstateManager::ActiveChainstate(*(ChainstateManager **)(fixture + 0x60));
  height = (int)((ulong)((long)(pCVar6->m_chain).vChain.
                               super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(pCVar6->m_chain).vChain.
                              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&metadata);
  std::filesystem::__cxx11::path::path(&local_b0,&root.super_path);
  tinyformat::format<int>((string *)&auto_outfile,"test_snapshot.%d.dat",&height);
  _Var1 = (_Variadic_union<CBlockIndex_*>)
          ((long)&res.m_variant.super__Variant_base<bilingual_str,_CBlockIndex_*>.
                  super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                  super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                  super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                  super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*> + 0x10);
  res.m_variant.super__Variant_base<bilingual_str,_CBlockIndex_*>.
  super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
  super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
  super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
  super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
  super__Variant_storage_alias<bilingual_str,_CBlockIndex_*>._M_u._M_rest = _Var1;
  std::__cxx11::u8string::
  _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((u8string *)&res,auto_outfile.m_file,
             auto_outfile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start + (long)auto_outfile.m_file);
  std::filesystem::__cxx11::path::path<std::__cxx11::u8string,std::filesystem::__cxx11::path>
            ((path *)&metadata,
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)&res,
             auto_format);
  std::filesystem::__cxx11::path::path((path *)&result,(path *)&metadata);
  std::filesystem::__cxx11::path::~path((path *)&metadata);
  if (res.m_variant.super__Variant_base<bilingual_str,_CBlockIndex_*>.
      super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
      super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
      super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
      super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
      super__Variant_storage_alias<bilingual_str,_CBlockIndex_*>._M_u._M_rest != _Var1) {
    operator_delete((void *)res.m_variant.super__Variant_base<bilingual_str,_CBlockIndex_*>.
                            super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                            super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                            super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                            super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                            super__Variant_storage_alias<bilingual_str,_CBlockIndex_*>._M_u._M_rest,
                    res.m_variant.super__Variant_base<bilingual_str,_CBlockIndex_*>.
                    super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                    super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                    super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                    super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                    super__Variant_storage_alias<bilingual_str,_CBlockIndex_*>._M_u._16_8_ + 1);
  }
  std::filesystem::__cxx11::path::operator/=(&local_b0,(path *)&result);
  std::filesystem::__cxx11::path::path(&snapshot_path.super_path,&local_b0);
  std::filesystem::__cxx11::path::~path((path *)&result);
  if (auto_outfile.m_file !=
      (FILE *)&auto_outfile.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish) {
    operator_delete(auto_outfile.m_file,
                    (ulong)(auto_outfile.m_xor.
                            super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                            super__Vector_impl_data._M_finish + 1));
  }
  std::filesystem::__cxx11::path::~path(&local_b0);
  pFVar7 = fsbridge::fopen((char *)&snapshot_path,"wb");
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_fffffffffffffdb0;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_fffffffffffffda8;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffffdb8;
  AutoFile::AutoFile(&auto_outfile,(FILE *)pFVar7,data_xor);
  pCVar6 = ChainstateManager::ActiveChainstate(*(ChainstateManager **)(fixture + 0x60));
  CreateUTXOSnapshot(&result,(NodeContext *)(fixture + 0x10),pCVar6,&auto_outfile,&snapshot_path,
                     &snapshot_path);
  pp_Var2 = &metadata.m_supported_versions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  metadata.m_supported_versions._M_t._M_impl._0_8_ = pp_Var2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&metadata,snapshot_path.super_path._M_pathname._M_dataplus._M_p,
             snapshot_path.super_path._M_pathname._M_dataplus._M_p +
             snapshot_path.super_path._M_pathname._M_string_length);
  UniValue::write_abi_cxx11_((UniValue *)&res,(int)&result,(void *)0x0,0);
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/chainstate.h"
  ;
  source_file._M_len = 0x66;
  logging_function._M_str = "CreateAndActivateUTXOSnapshot";
  logging_function._M_len = 0x1d;
  LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
            (logging_function,source_file,0x35,ALL,Info,(ConstevalFormatString<2U>)0xf54738,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&metadata,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res);
  if (res.m_variant.super__Variant_base<bilingual_str,_CBlockIndex_*>.
      super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
      super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
      super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
      super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
      super__Variant_storage_alias<bilingual_str,_CBlockIndex_*>._M_u._M_rest != _Var1) {
    operator_delete((void *)res.m_variant.super__Variant_base<bilingual_str,_CBlockIndex_*>.
                            super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                            super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                            super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                            super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                            super__Variant_storage_alias<bilingual_str,_CBlockIndex_*>._M_u._M_rest,
                    res.m_variant.super__Variant_base<bilingual_str,_CBlockIndex_*>.
                    super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                    super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                    super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                    super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                    super__Variant_storage_alias<bilingual_str,_CBlockIndex_*>._M_u._16_8_ + 1);
  }
  if ((_Base_ptr *)metadata.m_supported_versions._M_t._M_impl._0_8_ != pp_Var2) {
    operator_delete((void *)metadata.m_supported_versions._M_t._M_impl._0_8_,
                    (ulong)((long)&(metadata.m_supported_versions._M_t._M_impl.super__Rb_tree_header
                                    ._M_header._M_parent)->_M_color + 1));
  }
  pFVar7 = fsbridge::fopen((char *)&snapshot_path,"rb");
  pvVar8 = (void *)0x0;
  lVar9 = 0;
  data_xor_00.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data_xor_00.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data_xor_00.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  AutoFile::AutoFile(&auto_infile,(FILE *)pFVar7,data_xor_00);
  if (pvVar8 != (void *)0x0) {
    operator_delete(pvVar8,lVar9 - (long)pvVar8);
  }
  auVar3 = *(_Type *)(*(long *)(*(long *)(fixture + 0x60) + 0x728) + 0x170);
  res.m_variant.super__Variant_base<bilingual_str,_CBlockIndex_*>.
  super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
  super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
  super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
  super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
  super__Variant_storage_alias<bilingual_str,_CBlockIndex_*>._M_u._0_2_ = 2;
  __l._M_len = 1;
  __l._M_array = (iterator)&res;
  std::set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>::set
            (&metadata.m_supported_versions,__l,&local_211,&local_212);
  metadata.m_base_blockhash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  metadata.m_base_blockhash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  metadata.m_base_blockhash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  metadata.m_base_blockhash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  metadata.m_base_blockhash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  metadata.m_base_blockhash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  metadata.m_base_blockhash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  metadata.m_base_blockhash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  metadata.m_base_blockhash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  metadata.m_base_blockhash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  metadata.m_base_blockhash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  metadata.m_base_blockhash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  metadata.m_base_blockhash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  metadata.m_base_blockhash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  metadata.m_base_blockhash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  metadata.m_base_blockhash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  metadata.m_base_blockhash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  metadata.m_base_blockhash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  metadata.m_base_blockhash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  metadata.m_base_blockhash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  metadata.m_base_blockhash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  metadata.m_base_blockhash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  metadata.m_base_blockhash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  metadata.m_base_blockhash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  metadata.m_base_blockhash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  metadata.m_base_blockhash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  metadata.m_base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  metadata.m_base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  metadata.m_base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  metadata.m_base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  metadata.m_base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  metadata.m_base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  metadata.m_coins_count = 0;
  metadata.m_network_magic._M_elems = auVar3;
  node::SnapshotMetadata::Unserialize<AutoFile>(&metadata,&auto_infile);
  pCVar6 = ChainstateManager::ActiveChainstate(*(ChainstateManager **)(fixture + 0x60));
  ppCVar5 = (pCVar6->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar5 ==
      (pCVar6->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    block = (CBlockIndex *)0x0;
  }
  else {
    block = ppCVar5[-1];
  }
  if (block->pprev != (CBlockIndex *)0x0) {
    CChain::SetTip(&pCVar6->m_chain,block->pprev);
  }
  ChainstateManager::ActivateSnapshot
            (&res,*(ChainstateManager **)(fixture + 0x60),&auto_infile,&metadata,false);
  CChain::SetTip(&pCVar6->m_chain,block);
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_CBlockIndex_*>::~_Variant_storage
            ((_Variant_storage<false,_bilingual_str,_CBlockIndex_*> *)&res);
  std::
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  ::~_Rb_tree((_Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
               *)&metadata);
  AutoFile::~AutoFile(&auto_infile);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&result.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&result.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)result.val._M_dataplus._M_p != &result.val.field_2) {
    operator_delete(result.val._M_dataplus._M_p,result.val.field_2._M_allocated_capacity + 1);
  }
  AutoFile::~AutoFile(&auto_outfile);
  std::filesystem::__cxx11::path::~path(&snapshot_path.super_path);
  std::filesystem::__cxx11::path::~path(&root.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
    __stack_chk_fail();
  }
  return res.m_variant.super__Variant_base<bilingual_str,_CBlockIndex_*>.
         super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
         super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
         super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
         super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
         super__Variant_storage_alias<bilingual_str,_CBlockIndex_*>._M_index == '\x01';
}

Assistant:

static bool
CreateAndActivateUTXOSnapshot(
    TestingSetup* fixture,
    F malleation = NoMalleation,
    bool reset_chainstate = false,
    bool in_memory_chainstate = false)
{
    node::NodeContext& node = fixture->m_node;
    fs::path root = fixture->m_path_root;

    // Write out a snapshot to the test's tempdir.
    //
    int height;
    WITH_LOCK(::cs_main, height = node.chainman->ActiveHeight());
    fs::path snapshot_path = root / fs::u8path(tfm::format("test_snapshot.%d.dat", height));
    FILE* outfile{fsbridge::fopen(snapshot_path, "wb")};
    AutoFile auto_outfile{outfile};

    UniValue result = CreateUTXOSnapshot(
        node, node.chainman->ActiveChainstate(), auto_outfile, snapshot_path, snapshot_path);
    LogPrintf(
        "Wrote UTXO snapshot to %s: %s\n", fs::PathToString(snapshot_path.make_preferred()), result.write());

    // Read the written snapshot in and then activate it.
    //
    FILE* infile{fsbridge::fopen(snapshot_path, "rb")};
    AutoFile auto_infile{infile};
    node::SnapshotMetadata metadata{node.chainman->GetParams().MessageStart()};
    auto_infile >> metadata;

    malleation(auto_infile, metadata);

    if (reset_chainstate) {
        {
            // What follows is code to selectively reset chainstate data without
            // disturbing the existing BlockManager instance, which is needed to
            // recognize the headers chain previously generated by the chainstate we're
            // removing. Without those headers, we can't activate the snapshot below.
            //
            // This is a stripped-down version of node::LoadChainstate which
            // preserves the block index.
            LOCK(::cs_main);
            CBlockIndex *orig_tip = node.chainman->ActiveChainstate().m_chain.Tip();
            uint256 gen_hash = node.chainman->ActiveChainstate().m_chain[0]->GetBlockHash();
            node.chainman->ResetChainstates();
            node.chainman->InitializeChainstate(node.mempool.get());
            Chainstate& chain = node.chainman->ActiveChainstate();
            Assert(chain.LoadGenesisBlock());
            // These cache values will be corrected shortly in `MaybeRebalanceCaches`.
            chain.InitCoinsDB(1 << 20, true, false, "");
            chain.InitCoinsCache(1 << 20);
            chain.CoinsTip().SetBestBlock(gen_hash);
            chain.setBlockIndexCandidates.insert(node.chainman->m_blockman.LookupBlockIndex(gen_hash));
            chain.LoadChainTip();
            node.chainman->MaybeRebalanceCaches();

            // Reset the HAVE_DATA flags below the snapshot height, simulating
            // never-having-downloaded them in the first place.
            // TODO: perhaps we could improve this by using pruning to delete
            // these blocks instead
            CBlockIndex *pindex = orig_tip;
            while (pindex && pindex != chain.m_chain.Tip()) {
                // Remove all data and validity flags by just setting
                // BLOCK_VALID_TREE. Also reset transaction counts and sequence
                // ids that are set when blocks are received, to make test setup
                // more realistic and satisfy consistency checks in
                // CheckBlockIndex().
                assert(pindex->IsValid(BlockStatus::BLOCK_VALID_TREE));
                pindex->nStatus = BlockStatus::BLOCK_VALID_TREE;
                pindex->nTx = 0;
                pindex->m_chain_tx_count = 0;
                pindex->nSequenceId = 0;
                pindex = pindex->pprev;
            }
        }
        BlockValidationState state;
        if (!node.chainman->ActiveChainstate().ActivateBestChain(state)) {
            throw std::runtime_error(strprintf("ActivateBestChain failed. (%s)", state.ToString()));
        }
        Assert(
            0 == WITH_LOCK(node.chainman->GetMutex(), return node.chainman->ActiveHeight()));
    }

    auto& new_active = node.chainman->ActiveChainstate();
    auto* tip = new_active.m_chain.Tip();

    // Disconnect a block so that the snapshot chainstate will be ahead, otherwise
    // it will refuse to activate.
    //
    // TODO this is a unittest-specific hack, and we should probably rethink how to
    // better generate/activate snapshots in unittests.
    if (tip->pprev) {
        new_active.m_chain.SetTip(*(tip->pprev));
    }

    auto res = node.chainman->ActivateSnapshot(auto_infile, metadata, in_memory_chainstate);

    // Restore the old tip.
    new_active.m_chain.SetTip(*tip);
    return !!res;
}